

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmpEstimation.cpp
# Opt level: O2

int test(void)

{
  double *pdVar1;
  Index IVar2;
  ostream *poVar3;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar4;
  long lVar5;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar6;
  Matrix<double,__1,_1,_0,__1,_1> *src;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar7;
  Scalar *pSVar8;
  Vector zmpReEstimated;
  Vector forcesAndMoments;
  Vector flexibility;
  double unitCov2;
  Vector u0;
  Matrix sensorPosition2;
  double unitCov1;
  Vector zmpEstimated;
  Vector forcesAndMomentsReference;
  Vector xdifference;
  Matrix sensorPosition2Est;
  Matrix sensorPosition1Est;
  Matrix sensorPosition1;
  Matrix<double,__1,__1,_0,__1,__1> *local_1fe8;
  long lStack_1fe0;
  long local_1fd8;
  XprTypeNested pMStack_1fd0;
  long local_1fc8;
  long lStack_1fc0;
  Index local_1fb8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_1fa8 [4];
  Vector zmp;
  Vector forcesAndMomentsReal;
  Vector forcesAndMoments_source;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_1ef0;
  Matrix Cov;
  IndexedMatrixArray u;
  IndexedMatrixArray y;
  IndexedMatrixArray xRef;
  Scalar local_1d98;
  Scalar local_1d90;
  Scalar local_1d88;
  Scalar local_1d80;
  Scalar local_1d78;
  Scalar local_1d70;
  IndexedMatrixArray forcesAndMoments_output;
  IndexedMatrixArray zmpReEstimated_output;
  IndexedMatrixArray u_output;
  IndexedMatrixArray y_output;
  IndexedMatrixArray x_output;
  IndexedMatrixArray forcesAndMomentsRef;
  IndexedMatrixArray forceRLEGEst;
  IndexedMatrixArray forceLLEGEst;
  IndexedMatrixArray forceRLEGRef;
  IndexedMatrixArray forceLLEGRef;
  IndexedMatrixArray zmpRef;
  IndexedMatrixArray zmpEstimatedRef;
  Scalar local_1948 [7];
  IndexedMatrixArray deltax_output;
  IndexedMatrixArray forceRLEG_output;
  IndexedMatrixArray forceLLEG_output;
  IndexedMatrixArray zmp_output;
  IndexedMatrixArray zmpEstimated_output;
  ModelBaseEKFFlexEstimatorIMU est;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Starting");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ModelBaseEKFFlexEstimatorIMU(&est,0.005);
  Cov.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  Cov.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Cov.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&Cov.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,6,6);
  unitCov1 = 1000000.0;
  unitCov2 = 1000000.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
            (local_1fa8,&Cov,&unitCov1);
  y.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (local_1fa8,(Scalar *)&y);
  u.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&u);
  xRef.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&xRef);
  zmpEstimatedRef.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&zmpEstimatedRef);
  zmpRef.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&zmpRef);
  forcesAndMomentsRef.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&forcesAndMomentsRef);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&unitCov1);
  forceLLEGRef.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&forceLLEGRef);
  forceRLEGRef.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&forceRLEGRef);
  forceLLEGEst.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&forceLLEGEst);
  forceRLEGEst.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&forceRLEGEst);
  x_output.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&x_output);
  y_output.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&y_output);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&unitCov1);
  u_output.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&u_output);
  zmpEstimated_output.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&zmpEstimated_output);
  zmpReEstimated_output.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&zmpReEstimated_output);
  zmp_output.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&zmp_output);
  forceLLEG_output.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&forceLLEG_output);
  forceRLEG_output.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&forceRLEG_output);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&unitCov2);
  forcesAndMoments_output.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&forcesAndMoments_output);
  deltax_output.k_ = 0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&deltax_output);
  local_1fe8 = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_1fe8);
  local_1ef0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_1ef0);
  local_1948[0] = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,local_1948);
  sensorPosition1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&sensorPosition1);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&unitCov2);
  sensorPosition2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&sensorPosition2);
  sensorPosition1Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&sensorPosition1Est);
  sensorPosition2Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&sensorPosition2Est);
  u0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0
  ;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&u0);
  flexibility.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&flexibility);
  xdifference.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&xdifference);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&unitCov2);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished(local_1fa8);
  lVar5 = stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getInputSize();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)local_1fa8,lVar5 + -0xc,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&u0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_1fa8);
  y.k_ = 0x3f8bc91ec262e67f;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1fa8,&u0,
             (Scalar *)&y);
  u.k_ = 0x3f592a737110e454;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1fa8,
                      (Scalar *)&u);
  xRef.k_ = 0x3fe9d8c2a454de7f;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&xRef);
  zmpEstimatedRef.k_ = -0x413afe2a00c9426d;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&zmpEstimatedRef);
  zmpRef.k_ = -0x41b9b63fd4611868;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&zmpRef);
  forcesAndMomentsRef.k_ = 0x3e6d294589eb75d1;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&forcesAndMomentsRef);
  forceLLEGRef.k_ = -0x413afdf88669871c;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&forceLLEGRef);
  forceRLEGRef.k_ = -0x41b9ad9e40441de1;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&forceRLEGRef);
  forceLLEGEst.k_ = 0x3e6d46d5b27abdf9;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&forceLLEGEst);
  forceRLEGEst.k_ = 0x40481141205bc01a;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&forceRLEGEst);
  x_output.k_ = 0x404779930be0ded3;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&x_output);
  y_output.k_ = 0x3ffc2bbecaab8a5d;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&y_output);
  u_output.k_ = -0x4049e6114170e398;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&u_output);
  zmpEstimated_output.k_ = -0x401cf6d330941c82;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&zmpEstimated_output);
  zmpReEstimated_output.k_ = -0x405b67ae6502b918;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&zmpReEstimated_output);
  zmp_output.k_ = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&zmp_output);
  forceLLEG_output.k_ = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&forceLLEG_output);
  forceRLEG_output.k_ = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&forceRLEG_output);
  forcesAndMoments_output.k_ = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&forcesAndMoments_output);
  deltax_output.k_ = 0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&deltax_output);
  local_1fe8 = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&local_1fe8);
  local_1ef0.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&local_1ef0);
  local_1948[0] = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,local_1948);
  sensorPosition1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&sensorPosition1);
  sensorPosition2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&sensorPosition2);
  sensorPosition1Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&sensorPosition1Est);
  sensorPosition2Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&sensorPosition2Est);
  flexibility.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0xbfb916872b020c4a;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&flexibility);
  xdifference.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0xbde0b71690f003f3;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&xdifference);
  forcesAndMoments_source.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x3ff1e0ded288ce70;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&forcesAndMoments_source);
  forcesAndMomentsReference.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
  .m_data = (double *)0x3b772d7254ebd468;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&forcesAndMomentsReference);
  forcesAndMoments.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0xbbc90cfd21b07db3;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&forcesAndMoments);
  forcesAndMomentsReal.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x3b8d4aad3d51257d;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&forcesAndMomentsReal);
  zmpEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0xbec7dfee863bb402;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&zmpEstimated);
  zmpReEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0xbe497262f127ea13;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&zmpReEstimated);
  zmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0xbc54e06e9873dcb2;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,(Scalar *)&zmp);
  local_1d70 = 2.95535e-20;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,&local_1d70);
  local_1d78 = -1.0346e-18;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,&local_1d78);
  local_1d80 = 7.58731e-20;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,&local_1d80);
  local_1d88 = -0.000284609;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,&local_1d88);
  local_1d90 = -1.18496e-06;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar6,&local_1d90);
  local_1d98 = -4.52691e-16;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar6,&local_1d98);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1fa8);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setSamplingPeriod(0.005);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setInput((Matrix *)&est);
  stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
            ((Matrix *)&est);
  u.k_ = CONCAT44(u.k_._4_4_,40000);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&y,(int *)&u,(StorageBaseType *)&xRef);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_1fa8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&y);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfe((Matrix *)&est);
  u.k_ = CONCAT44(u.k_._4_4_,600);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&y,(int *)&u,(StorageBaseType *)&xRef);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_1fa8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&y);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfv((Matrix *)&est);
  u.k_ = CONCAT44(u.k_._4_4_,400);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&y,(int *)&u,(StorageBaseType *)&xRef);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_1fa8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&y);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKte((Matrix *)&est);
  u.k_ = CONCAT44(u.k_._4_4_,10);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&y,(int *)&u,(StorageBaseType *)&xRef);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_1fa8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&y);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKtv((Matrix *)&est);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&y);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading measurements file");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&y,"data/source_measurement.dat",1,6,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&u);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading input file");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&u,"data/source_input.dat",1,lVar5,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&xRef);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading reference state file");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&xRef,"data/source_state.dat",0x12,1,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&zmpEstimatedRef);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading reference zmpEstimated file");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&zmpEstimatedRef,"data/source_zmpestimated.dat",3,1,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&zmpRef);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading reference zmp file");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&zmpRef,"data/source_zmp.dat",3,1,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&forcesAndMomentsRef);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading reference forcesAndMoments file");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&forcesAndMomentsRef,"data/source_forcesAndMoments.dat",0xc,1,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&forceLLEGRef);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading reference forceLLEG file");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&forceLLEGRef,"data/source_forceLLEG.dat",6,1,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&forceRLEGRef);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading reference forceRLEG file");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&forceRLEGRef,"data/source_forceRLEG.dat",6,1,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&forceLLEGEst);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading estimated forceLLEG file");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&forceLLEGEst,"data/source_forcesSupport1.dat",6,1,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&forceRLEGEst);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading estimated forceRLEG file");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&forceRLEGEst,"data/source_forcesSupport2.dat",6,1,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&x_output);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&y_output);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&u_output);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&zmpEstimated_output);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&zmpReEstimated_output);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&zmp_output);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&forceLLEG_output);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&forceRLEG_output);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&forcesAndMoments_output);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&deltax_output);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  setMeasurementNoiseCovariance((Matrix *)&est);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactsNumber
            ((uint)&est);
  flexibility.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  flexibility.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&flexibility.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,0x12);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&xdifference,
             (DenseStorage<double,__1,__1,_1,_0> *)&flexibility);
  forcesAndMoments_source.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  forcesAndMoments_source.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&forcesAndMoments_source.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             ,0xc);
  forcesAndMomentsReference.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
  .m_data = (double *)0x0;
  forcesAndMomentsReference.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
  .m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&forcesAndMomentsReference.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,0xc);
  forcesAndMoments.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  forcesAndMoments.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&forcesAndMoments.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,0xc);
  forcesAndMomentsReal.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  forcesAndMomentsReal.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&forcesAndMomentsReal.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             0xc);
  zmpEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  zmpEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  zmpReEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  zmpReEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&zmpEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&zmpReEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,3);
  zmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  zmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&zmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,3);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactModel((uint)&est)
  ;
  sensorPosition1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  sensorPosition1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  sensorPosition1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  sensorPosition2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  sensorPosition2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  sensorPosition2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  sensorPosition1Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  sensorPosition1Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  sensorPosition1Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  sensorPosition2Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  sensorPosition2Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  sensorPosition2Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&sensorPosition1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,4,4);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&sensorPosition2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,4,4);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&sensorPosition1Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,4,
             4);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&sensorPosition2Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,4,
             4);
  poVar3 = std::operator<<((ostream *)&std::cout,"Beginning reconstruction ");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (lVar5 = 2; lVar5 != 0xa709; lVar5 = lVar5 + 1) {
    local_1fe8 = stateObservation::
                 IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                 ::operator[](&y,lVar5);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_1fa8,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               &local_1fe8);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)&est);
    free(local_1fa8[0].m_xpr);
    local_1fe8 = stateObservation::
                 IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                 ::operator[](&u,lVar5);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_1fa8,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               &local_1fe8);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)&est);
    free(local_1fa8[0].m_xpr);
    src = (Matrix<double,__1,_1,_0,__1,_1> *)
          stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
          getFlexibilityVector();
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&flexibility,src);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1fa8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&flexibility);
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::setValue(&x_output,(Matrix<double,__1,__1,_0,__1,__1> *)local_1fa8,lVar5);
    free(local_1fa8[0].m_xpr);
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[](&y,lVar5);
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::setValue(&y_output,pMVar7,lVar5);
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[](&u,lVar5);
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::setValue(&u_output,pMVar7,lVar5);
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[](&forcesAndMomentsRef,lVar5);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&forcesAndMomentsReference,pMVar7);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getForcesAndMoments();
    IVar2 = forcesAndMoments.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    pdVar1 = forcesAndMoments.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    forcesAndMoments.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = (double *)local_1fa8[0].m_xpr;
    forcesAndMoments.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = local_1fa8[0].m_row;
    local_1fa8[0].m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pdVar1;
    local_1fa8[0].m_row = IVar2;
    free(pdVar1);
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[](&u,lVar5);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              (&local_1ef0,pMVar7,0,0x2a,1,6);
    local_1fb8 = local_1ef0.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_outerStride;
    local_1fc8 = local_1ef0.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_startRow.m_value;
    lStack_1fc0 = local_1ef0.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .m_startCol.m_value;
    local_1fd8 = local_1ef0.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_cols.m_value;
    pMStack_1fd0 = local_1ef0.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                   .m_xpr;
    local_1fe8 = (Matrix<double,__1,__1,_0,__1,__1> *)
                 local_1ef0.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_data;
    lStack_1fe0 = local_1ef0.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  .m_rows.m_value;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>>
              ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_1948,
               (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                *)&local_1fe8);
    stateObservation::kine::vector6ToHomogeneousMatrix((Matrix4 *)local_1fa8,(Vector6 *)local_1948);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,4,4,0,4,4>>
              (&sensorPosition1,(Matrix<double,_4,_4,_0,_4,_4> *)local_1fa8);
    pMVar7 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[](&u,lVar5);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              (&local_1ef0,pMVar7,0,0x30,1,6);
    local_1fb8 = local_1ef0.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_outerStride;
    local_1fc8 = local_1ef0.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_startRow.m_value;
    lStack_1fc0 = local_1ef0.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .m_startCol.m_value;
    local_1fd8 = local_1ef0.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_cols.m_value;
    pMStack_1fd0 = local_1ef0.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                   .m_xpr;
    local_1fe8 = (Matrix<double,__1,__1,_0,__1,__1> *)
                 local_1ef0.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_data;
    lStack_1fe0 = local_1ef0.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  .m_rows.m_value;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>>
              ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_1948,
               (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                *)&local_1fe8);
    stateObservation::kine::vector6ToHomogeneousMatrix((Matrix4 *)local_1fa8,(Vector6 *)local_1948);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,4,4,0,4,4>>
              (&sensorPosition2,(Matrix<double,_4,_4,_0,_4,_4> *)local_1fa8);
    computeZmp((Vector *)local_1fa8,(Matrix *)&forcesAndMoments,&sensorPosition1,
               (uint)&sensorPosition2);
    IVar2 = zmpReEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    pdVar1 = zmpReEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
    zmpReEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)local_1fa8[0].m_xpr;
    zmpReEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         local_1fa8[0].m_row;
    local_1fa8[0].m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pdVar1;
    local_1fa8[0].m_row = IVar2;
    free(pdVar1);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&zmpEstimated,
                        0);
    if (100.0 < *pSVar8) {
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &zmpEstimated,0);
      *pSVar8 = 100.0;
    }
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&zmpEstimated,
                        1);
    if (100.0 < *pSVar8) {
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &zmpEstimated,1);
      *pSVar8 = 100.0;
    }
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&zmpEstimated,
                        2);
    if (100.0 < *pSVar8) {
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &zmpEstimated,2);
      *pSVar8 = 100.0;
    }
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&zmpEstimated,
                        0);
    if (*pSVar8 <= -100.0 && *pSVar8 != -100.0) {
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &zmpEstimated,0);
      *pSVar8 = -100.0;
    }
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&zmpEstimated,
                        1);
    if (*pSVar8 <= -100.0 && *pSVar8 != -100.0) {
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &zmpEstimated,1);
      *pSVar8 = -100.0;
    }
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&zmpEstimated,
                        2);
    if (*pSVar8 <= -100.0 && *pSVar8 != -100.0) {
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &zmpEstimated,2);
      *pSVar8 = -100.0;
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1fa8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&forcesAndMoments);
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::setValue(&forcesAndMoments_output,(Matrix<double,__1,__1,_0,__1,__1> *)local_1fa8,lVar5);
    free(local_1fa8[0].m_xpr);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1fa8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&zmpReEstimated);
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::setValue(&zmpReEstimated_output,(Matrix<double,__1,__1,_0,__1,__1> *)local_1fa8,lVar5);
    free(local_1fa8[0].m_xpr);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Completed ");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::writeInFile(&x_output,"state.dat",false,false);
  poVar3 = std::operator<<((ostream *)&std::cout,"coucou");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::writeInFile(&y_output,"measurement.dat",false,false);
  poVar3 = std::operator<<((ostream *)&std::cout,"coucou");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::writeInFile(&u_output,"input.dat",false,false);
  poVar3 = std::operator<<((ostream *)&std::cout,"coucou");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::writeInFile(&forcesAndMoments_output,"forcesAndMoments.dat",false,false);
  poVar3 = std::operator<<((ostream *)&std::cout,"coucou");
  std::endl<char,std::char_traits<char>>(poVar3);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::writeInFile(&zmpReEstimated_output,"zmpReEstimated.dat",false,false);
  poVar3 = std::operator<<((ostream *)&std::cout,"coucou");
  std::endl<char,std::char_traits<char>>(poVar3);
  free(sensorPosition2Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  free(sensorPosition1Est.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  free(sensorPosition2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(sensorPosition1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(zmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(zmpReEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(zmpEstimated.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  free(forcesAndMomentsReal.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
       .m_data);
  free(forcesAndMoments.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(forcesAndMomentsReference.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(forcesAndMoments_source.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(xdifference.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(flexibility.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&deltax_output.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&forcesAndMoments_output.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&forceRLEG_output.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&forceLLEG_output.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&zmp_output.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&zmpReEstimated_output.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&zmpEstimated_output.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&u_output.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&y_output.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&x_output.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&forceRLEGEst.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&forceLLEGEst.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&forceRLEGRef.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&forceLLEGRef.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&forcesAndMomentsRef.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&zmpRef.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&zmpEstimatedRef.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&xRef.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&u.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&y.v_);
  free(u0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(Cov.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ~ModelBaseEKFFlexEstimatorIMU(&est);
  return 0;
}

Assistant:

int test()
{
  std::cout << "Starting" << std::endl;

  /// sampling period
  const double dt = 5e-3;

  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU est;

  /// Measurement noise covariance
  Matrix Cov;
  Cov.resize(6, 6);
  double unitCov1 = 1e6;
  double unitCov2 = 1e6;
  Cov << unitCov1, 0, 0, 0, 0, 0, 0, unitCov1, 0, 0, 0, 0, 0, 0, unitCov1, 0, 0, 0, 0, 0, 0, unitCov2, 0, 0, 0, 0, 0, 0,
      unitCov2, 0, 0, 0, 0, 0, 0, unitCov2;

  /// Initializations
  // Dimensions
  const unsigned long kinit = 0;
  const unsigned long kmax = 42761;
  const unsigned measurementSize = 6;

  const unsigned stateSize = 18;
  unsigned contactNbr = 2;
  // State initialization => not used here because it is set in model-base-ekf-flex-estimator-imu

  const Index inputSize = est.getInputSize();

  // Input initialization
  Vector u0 = Vector::Zero(inputSize - 6 * contactNbr, 1);
  u0 << 0.0135672, 0.001536, 0.80771, -2.50425e-06, -1.03787e-08, 5.4317e-08, -2.50434e-06, -1.03944e-08, 5.45321e-08,
      48.1348, 46.9498, 1.76068, -0.0863332, -0.59487, -0.0402246, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, -0.098,
      -1.21619e-10, 1.1174, 3.06752e-22, -1.06094e-20, 7.75345e-22, -2.84609e-06, -1.18496e-08, -4.52691e-18,
      2.95535e-20, -1.0346e-18, 7.58731e-20, -0.000284609, -1.18496e-06, -4.52691e-16;

  est.setSamplingPeriod(dt);

  est.setInput(u0);
  est.setMeasurementInput(u0);

  est.setKfe(40000 * Matrix3::Identity());
  est.setKfv(600 * Matrix3::Identity());
  est.setKte(400 * Matrix3::Identity());
  est.setKtv(10 * Matrix3::Identity());

  /// Definitions of input vectors
  // Measurement
  IndexedMatrixArray y;
  std::cout << "Loading measurements file" << std::endl;
  y.readFromFile("data/source_measurement.dat", 1, measurementSize);
  // Input
  IndexedMatrixArray u;
  std::cout << "Loading input file" << std::endl;
  u.readFromFile("data/source_input.dat", 1, inputSize);
  // state
  IndexedMatrixArray xRef;
  std::cout << "Loading reference state file" << std::endl;
  xRef.readFromFile("data/source_state.dat", stateSize, 1);

  // zmp estimated ref
  IndexedMatrixArray zmpEstimatedRef;
  std::cout << "Loading reference zmpEstimated file" << std::endl;
  zmpEstimatedRef.readFromFile("data/source_zmpestimated.dat", 3, 1);
  // zmp
  IndexedMatrixArray zmpRef;
  std::cout << "Loading reference zmp file" << std::endl;
  zmpRef.readFromFile("data/source_zmp.dat", 3, 1);
  // forcesAndMoments
  IndexedMatrixArray forcesAndMomentsRef;
  std::cout << "Loading reference forcesAndMoments file" << std::endl;
  forcesAndMomentsRef.readFromFile("data/source_forcesAndMoments.dat", 12, 1);
  // forceLLEG
  IndexedMatrixArray forceLLEGRef;
  std::cout << "Loading reference forceLLEG file" << std::endl;
  forceLLEGRef.readFromFile("data/source_forceLLEG.dat", 6, 1);
  // forceRLEG
  IndexedMatrixArray forceRLEGRef;
  std::cout << "Loading reference forceRLEG file" << std::endl;
  forceRLEGRef.readFromFile("data/source_forceRLEG.dat", 6, 1);
  // forceLLEG estimated
  IndexedMatrixArray forceLLEGEst;
  std::cout << "Loading estimated forceLLEG file" << std::endl;
  forceLLEGEst.readFromFile("data/source_forcesSupport1.dat", 6, 1);
  // forceRLEG estimated
  IndexedMatrixArray forceRLEGEst;
  std::cout << "Loading estimated forceRLEG file" << std::endl;
  forceRLEGEst.readFromFile("data/source_forcesSupport2.dat", 6, 1);

  /// Definition of ouptut vectors
  // State: what we want
  IndexedMatrixArray x_output;
  // Measurement
  IndexedMatrixArray y_output;
  // Input
  IndexedMatrixArray u_output;

  // ZMP estimated
  IndexedMatrixArray zmpEstimated_output;
  IndexedMatrixArray zmpReEstimated_output;
  // ZMP
  IndexedMatrixArray zmp_output;
  // force LLEG
  IndexedMatrixArray forceLLEG_output;
  // force RLEG
  IndexedMatrixArray forceRLEG_output;
  // forcesAndMoments
  IndexedMatrixArray forcesAndMoments_output;

  IndexedMatrixArray deltax_output;

  est.setMeasurementNoiseCovariance(Cov);
  est.setContactsNumber(contactNbr);

  Vector flexibility;
  flexibility.resize(18);
  Vector xdifference(flexibility);

  Vector forcesAndMoments_source;
  forcesAndMoments_source.resize(12);

  Vector forcesAndMomentsReference;
  forcesAndMomentsReference.resize(12);

  stateObservation::Vector forcesAndMoments;
  forcesAndMoments.resize(12);
  Vector forcesAndMomentsReal;
  forcesAndMomentsReal.resize(12);
  Vector zmpEstimated, zmpReEstimated;
  zmpEstimated.resize(3), zmpReEstimated.resize(3);
  Vector zmp;
  zmp.resize(3);

  est.setContactModel(
      stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::contactModel::elasticContact);

  Matrix sensorPosition1, sensorPosition2, sensorPosition1Est, sensorPosition2Est;
  sensorPosition1.resize(4, 4);
  sensorPosition2.resize(4, 4);
  sensorPosition1Est.resize(4, 4);
  sensorPosition2Est.resize(4, 4);

  std::cout << "Beginning reconstruction " << std::endl;
  for(unsigned long k = kinit + 2; k < kmax; ++k)
  {
    est.setMeasurement(y[k].transpose());
    est.setMeasurementInput(u[k].transpose());

    flexibility = est.getFlexibilityVector();

    x_output.setValue(flexibility, k);
    y_output.setValue(y[k], k);
    u_output.setValue(u[k], k);

    forcesAndMomentsReference = forcesAndMomentsRef[k];
    forcesAndMoments = est.getForcesAndMoments();
    //        forcesAndMoments.block(0,0,6,1)=forceRLEGEst[k];
    //        forcesAndMoments.block(6,0,6,1)=forceLLEGEst[k];

    // Compute forces and ZMP estimated in this code
    sensorPosition1 = kine::vector6ToHomogeneousMatrix((u[k].block(0, 42, 1, 6)).transpose());
    sensorPosition2 = kine::vector6ToHomogeneousMatrix((u[k].block(0, 48, 1, 6)).transpose());
    zmpReEstimated = computeZmp(forcesAndMoments, sensorPosition1, sensorPosition2, contactNbr);

    //        // Compute forces and ZMP estimated
    //        sensorPosition1Est=kine::vector6ToHomogeneousMatrix((u[k].block(0,42,1,6)).transpose());
    //        sensorPosition2Est=kine::vector6ToHomogeneousMatrix((u[k].block(0,48,1,6)).transpose());
    //        sensorPosition1Est(0,3)=0;
    //        sensorPosition2Est(0,3)=0;
    //        zmpEstimated=computeZmp (forcesAndMoments, sensorPosition1Est, sensorPosition2Est, contactNbr);

    //        // Compute ZMP real
    //        forcesAndMoments_source.block(0,0,6,1)=forceRLEGRef[k];
    //        forcesAndMoments_source.block(6,0,6,1)=forceLLEGRef[k];
    //        zmp=computeZmp (forcesAndMoments_source, sensorPosition1, sensorPosition2, contactNbr);

    if(zmpEstimated(0) > 100)
    {
      zmpEstimated(0) = 100;
    }
    if(zmpEstimated(1) > 100)
    {
      zmpEstimated(1) = 100;
    }
    if(zmpEstimated(2) > 100)
    {
      zmpEstimated(2) = 100;
    }
    if(zmpEstimated(0) < -100)
    {
      zmpEstimated(0) = -100;
    }
    if(zmpEstimated(1) < -100)
    {
      zmpEstimated(1) = -100;
    }
    if(zmpEstimated(2) < -100)
    {
      zmpEstimated(2) = -100;
    }

    forcesAndMoments_output.setValue(forcesAndMoments, k);
    zmpReEstimated_output.setValue(zmpReEstimated, k);
    // zmp_output.setValue(zmp,k);
  }

  std::cout << "Completed " << std::endl;

  x_output.writeInFile("state.dat");
  std::cout << "coucou" << std::endl;
  y_output.writeInFile("measurement.dat");
  std::cout << "coucou" << std::endl;
  u_output.writeInFile("input.dat");
  std::cout << "coucou" << std::endl;
  forcesAndMoments_output.writeInFile("forcesAndMoments.dat");
  std::cout << "coucou" << std::endl;
  zmpReEstimated_output.writeInFile("zmpReEstimated.dat");
  std::cout << "coucou" << std::endl;
  // zmp_output.writeInFile("zmp.dat");

  return 0;
}